

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

resizable_tensor * __thiscall
dlib::resizable_tensor::operator=
          (resizable_tensor *this,
          matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
          *item)

{
  long k_;
  
  if ((this->super_tensor).m_n == *(long *)(item + 8)) {
    k_ = *(long *)(item + 0x10);
    if ((this->super_tensor).m_nr * (this->super_tensor).m_k * (this->super_tensor).m_nc - k_ == 0)
    goto LAB_0017ccb5;
  }
  else {
    k_ = *(long *)(item + 0x10);
  }
  set_size(this,*(long *)(item + 8),k_,1,1);
LAB_0017ccb5:
  tensor::operator=(&this->super_tensor,item);
  return this;
}

Assistant:

resizable_tensor& operator= (
            const matrix_exp<EXP>& item
        )
        {
            if (!(num_samples() == item.nr() && k()*nr()*nc() == item.nc()))
                set_size(item.nr(), item.nc());
            tensor::operator=(item);
            return *this;
        }